

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_state.cpp
# Opt level: O3

entry * libtorrent::dht::anon_unknown_6::save_nodes
                  (entry *__return_storage_ptr__,
                  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                  *nodes)

{
  pointer pbVar1;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *this;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar2;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *extraout_RAX;
  pointer e;
  string node;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  entry *local_40;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  entry::entry(__return_storage_ptr__,list_t);
  local_40 = __return_storage_ptr__;
  this = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
         entry::list(__return_storage_ptr__);
  e = (nodes->
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (nodes->
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = this;
  if (e != pbVar1) {
    do {
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_38.container = &local_60;
      aux::
      write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::back_insert_iterator<std::__cxx11::string>&>
                (e,&local_38);
      pvVar2 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
               ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
               emplace_back<std::__cxx11::string&>(this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
        pvVar2 = extraout_RAX;
      }
      e = e + 1;
    } while (e != pbVar1);
  }
  return (entry *)pvVar2;
}

Assistant:

entry save_nodes(std::vector<udp::endpoint> const& nodes)
	{
		entry ret(entry::list_t);
		entry::list_type& list = ret.list();
		for (auto const& ep : nodes)
		{
			std::string node;
			std::back_insert_iterator<std::string> out(node);
			aux::write_endpoint(ep, out);
			list.emplace_back(node);
		}
		return ret;
	}